

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_underlying_type_test_generated.h
# Opt level: O3

Offset<void> __thiscall
UnionUnderlyingType::ABCUnion::Pack
          (ABCUnion *this,FlatBufferBuilder *_fbb,rehasher_function_t *_rehasher)

{
  uchar e;
  ABC AVar1;
  int e_00;
  size_t len;
  uoffset_t uVar2;
  Offset<flatbuffers::String> off;
  
  AVar1 = this->type;
  if (AVar1 == C) {
    e = *this->value;
    flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
    _fbb->nested = true;
    uVar2 = (_fbb->buf_).size_;
    flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(_fbb,4,e,'\0');
  }
  else if (AVar1 == B) {
    len = *(size_t *)((long)this->value + 8);
    if (len == 0) {
      off.o = 0;
    }
    else {
      flatbuffers::FlatBufferBuilderImpl<false>::CreateStringImpl(_fbb,*this->value,len);
      off.o = (_fbb->buf_).size_;
    }
    flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
    _fbb->nested = true;
    uVar2 = (_fbb->buf_).size_;
    flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(_fbb,4,off);
  }
  else {
    if (AVar1 != A) {
      return (Offset<void>)0;
    }
    e_00 = *this->value;
    flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
    _fbb->nested = true;
    uVar2 = (_fbb->buf_).size_;
    flatbuffers::FlatBufferBuilderImpl<false>::AddElement<int>(_fbb,4,e_00,0);
  }
  uVar2 = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(_fbb,uVar2);
  return (Offset<void>)uVar2;
}

Assistant:

inline ::flatbuffers::Offset<void> ABCUnion::Pack(::flatbuffers::FlatBufferBuilder &_fbb, const ::flatbuffers::rehasher_function_t *_rehasher) const {
  (void)_rehasher;
  switch (type) {
    case ABC::A: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::AT *>(value);
      return CreateA(_fbb, ptr, _rehasher).Union();
    }
    case ABC::B: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::BT *>(value);
      return CreateB(_fbb, ptr, _rehasher).Union();
    }
    case ABC::C: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::CT *>(value);
      return CreateC(_fbb, ptr, _rehasher).Union();
    }
    default: return 0;
  }
}